

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

m256v * m256v_get_subview(m256v *M,int row_offs,int col_offs,int n_row,int n_col)

{
  uint8_t *puVar1;
  size_t sVar2;
  int in_ECX;
  int in_EDX;
  m256v *in_RSI;
  m256v *in_RDI;
  int in_R8D;
  int in_R9D;
  m256v *R;
  
  in_RDI->n_row = in_R8D;
  in_RDI->n_col = in_R9D;
  in_RDI->rstride = in_RSI->rstride;
  puVar1 = in_RSI->e;
  sVar2 = m256v_get_el_offs(in_RSI,in_EDX,in_ECX);
  in_RDI->e = puVar1 + sVar2;
  return in_RDI;
}

Assistant:

m256v m256v_get_subview(const m256v* M,
				int row_offs,
				int col_offs,
				int n_row,
				int n_col)
{
	assert(0 <= row_offs);
	assert(row_offs + n_row <= M->n_row);
	assert(0 <= col_offs);
	assert(col_offs + n_col <= M->n_col);

	m256v R;
	R.n_row = n_row;
	R.n_col = n_col;
	R.rstride = M->rstride;
	R.e = M->e + m256v_get_el_offs(M, row_offs, col_offs);

	return R;
}